

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O0

void handle_deploy_ack(EVmaster master,EVmaster_msg_ptr mmsg)

{
  int iVar1;
  __pid_t _Var2;
  long lVar3;
  pthread_t pVar4;
  long in_RSI;
  long *in_RDI;
  timespec ts_6;
  timespec ts_5;
  timespec ts_4;
  timespec ts_3;
  timespec ts_2;
  timespec ts_1;
  timespec ts;
  EVdfg dfg;
  CManager_conflict cm;
  EVdeploy_ack_ptr msg;
  undefined8 in_stack_fffffffffffffef8;
  CManager_conflict in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff38;
  FILE *pFVar5;
  CMTraceType trace_type;
  CManager in_stack_ffffffffffffff40;
  timespec local_98;
  timespec local_88;
  timespec local_78;
  timespec local_68;
  timespec local_58;
  timespec local_48;
  timespec local_38;
  long local_28;
  long local_20;
  undefined8 *local_18;
  long *local_8;
  
  trace_type = (CMTraceType)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  local_18 = (undefined8 *)(in_RSI + 0x10);
  local_20 = *in_RDI;
  local_28 = in_RDI[5];
  *(int *)(in_RDI[5] + 0x24) = *(int *)(in_RDI[5] + 0x24) + 1;
  local_8 = in_RDI;
  iVar1 = CMtrace_val[0xd];
  if (*(long *)(local_20 + 0x120) == 0) {
    iVar1 = CMtrace_init(in_stack_ffffffffffffff40,trace_type);
  }
  if (iVar1 != 0) {
    if (CMtrace_PID != 0) {
      pFVar5 = *(FILE **)(local_20 + 0x120);
      _Var2 = getpid();
      pVar4 = pthread_self();
      fprintf(pFVar5,"P%lxT%lx - ",(long)_Var2,pVar4);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,&local_38);
      fprintf(*(FILE **)(local_20 + 0x120),"%lld.%.9ld - ",local_38.tv_sec,local_38.tv_nsec);
    }
    fprintf(*(FILE **)(local_20 + 0x120),"Client %s reports deployed, count %d\n",*local_18,
            (ulong)*(uint *)(local_8[5] + 0x24));
  }
  fflush(*(FILE **)(local_20 + 0x120));
  if ((*(int *)(local_8[5] + 0x24) == *(int *)(*(long *)(local_28 + 8) + 0x34)) &&
     (*(int *)(local_28 + 0x28) != -1)) {
    iVar1 = CMtrace_val[0xd];
    if (*(long *)(local_20 + 0x120) == 0) {
      iVar1 = CMtrace_init(in_stack_ffffffffffffff40,trace_type);
    }
    if (iVar1 != 0) {
      if (CMtrace_PID != 0) {
        pFVar5 = *(FILE **)(local_20 + 0x120);
        _Var2 = getpid();
        pVar4 = pthread_self();
        fprintf(pFVar5,"P%lxT%lx - ",(long)_Var2,pVar4);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_48);
        fprintf(*(FILE **)(local_20 + 0x120),"%lld.%.9ld - ",local_48.tv_sec,local_48.tv_nsec);
      }
      fprintf(*(FILE **)(local_20 + 0x120),"That was the last one, Signalling %d\n",
              (ulong)*(uint *)(local_28 + 0x28));
    }
    fflush(*(FILE **)(local_20 + 0x120));
    iVar1 = CMtrace_val[0xd];
    if (*(long *)(local_20 + 0x120) == 0) {
      iVar1 = CMtrace_init(in_stack_ffffffffffffff40,trace_type);
    }
    if (iVar1 != 0) {
      if (CMtrace_PID != 0) {
        pFVar5 = *(FILE **)(local_20 + 0x120);
        _Var2 = getpid();
        in_stack_ffffffffffffff40 = (CManager)(long)_Var2;
        pVar4 = pthread_self();
        fprintf(pFVar5,"P%lxT%lx - ",in_stack_ffffffffffffff40,pVar4);
        trace_type = (CMTraceType)((ulong)pFVar5 >> 0x20);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_58);
        fprintf(*(FILE **)(local_20 + 0x120),"%lld.%.9ld - ",local_58.tv_sec,local_58.tv_nsec);
      }
      fprintf(*(FILE **)(local_20 + 0x120),
              "EVDFG exit deploy ack handler -  master DFG state is %s\n",
              str_state[*(uint *)(local_8 + 6)]);
    }
    fflush(*(FILE **)(local_20 + 0x120));
    CMCondition_signal(in_stack_ffffffffffffff00,(int)((ulong)in_stack_fffffffffffffef8 >> 0x20));
    *(undefined4 *)(local_8[5] + 0x28) = 0xffffffff;
    if ((int)local_8[6] != 1) {
      __assert_fail("master->state == DFG_Starting",
                    "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/ev_dfg.c"
                    ,0x9c6,"void handle_deploy_ack(EVmaster, EVmaster_msg_ptr)");
    }
    *(undefined4 *)(local_8 + 6) = 2;
    iVar1 = CMtrace_val[0xd];
    if (*(long *)(local_20 + 0x120) == 0) {
      iVar1 = CMtrace_init(in_stack_ffffffffffffff40,trace_type);
    }
    if (iVar1 != 0) {
      if (CMtrace_PID != 0) {
        pFVar5 = *(FILE **)(local_20 + 0x120);
        _Var2 = getpid();
        pVar4 = pthread_self();
        fprintf(pFVar5,"P%lxT%lx - ",(long)_Var2,pVar4);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_68);
        fprintf(*(FILE **)(local_20 + 0x120),"%lld.%.9ld - ",local_68.tv_sec,local_68.tv_nsec);
      }
      fprintf(*(FILE **)(local_20 + 0x120),"EVDFG  -  master DFG state set to %s\n",
              str_state[*(uint *)(local_8 + 6)]);
    }
    fflush(*(FILE **)(local_20 + 0x120));
  }
  else if ((int)local_8[6] == 3) {
    if (*(int *)(local_8[5] + 0x24) == *(int *)(*(long *)(local_28 + 8) + 0x34)) {
      *(undefined4 *)(local_8 + 6) = 2;
      iVar1 = CMtrace_val[0xd];
      if (*(long *)(local_20 + 0x120) == 0) {
        iVar1 = CMtrace_init(in_stack_ffffffffffffff40,trace_type);
      }
      if (iVar1 != 0) {
        if (CMtrace_PID != 0) {
          pFVar5 = *(FILE **)(local_20 + 0x120);
          _Var2 = getpid();
          pVar4 = pthread_self();
          fprintf(pFVar5,"P%lxT%lx - ",(long)_Var2,pVar4);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,&local_78);
          fprintf(*(FILE **)(local_20 + 0x120),"%lld.%.9ld - ",local_78.tv_sec,local_78.tv_nsec);
        }
        fprintf(*(FILE **)(local_20 + 0x120),
                "EVDFG after reconfiguration -  master DFG state set to %s\n",
                str_state[*(uint *)(local_8 + 6)]);
      }
      fflush(*(FILE **)(local_20 + 0x120));
    }
    else {
      iVar1 = CMtrace_val[0xd];
      if (*(long *)(local_20 + 0x120) == 0) {
        iVar1 = CMtrace_init(in_stack_ffffffffffffff40,trace_type);
      }
      if (iVar1 != 0) {
        if (CMtrace_PID != 0) {
          pFVar5 = *(FILE **)(local_20 + 0x120);
          _Var2 = getpid();
          pVar4 = pthread_self();
          fprintf(pFVar5,"P%lxT%lx - ",(long)_Var2,pVar4);
        }
        if (CMtrace_timing != 0) {
          clock_gettime(1,&local_88);
          fprintf(*(FILE **)(local_20 + 0x120),"%lld.%.9ld - ",local_88.tv_sec,local_88.tv_nsec);
        }
        fprintf(*(FILE **)(local_20 + 0x120),
                "EVDFG reconfiguration in progress.  Deploy ack count %d, -  master DFG state set remains %s\n"
                ,(ulong)*(uint *)(local_8[5] + 0x24),str_state[*(uint *)(local_8 + 6)]);
      }
      fflush(*(FILE **)(local_20 + 0x120));
    }
  }
  iVar1 = CMtrace_val[0xd];
  if (*(long *)(local_20 + 0x120) == 0) {
    iVar1 = CMtrace_init(in_stack_ffffffffffffff40,trace_type);
  }
  if (iVar1 != 0) {
    if (CMtrace_PID != 0) {
      pFVar5 = *(FILE **)(local_20 + 0x120);
      _Var2 = getpid();
      lVar3 = (long)_Var2;
      pVar4 = pthread_self();
      fprintf(pFVar5,"P%lxT%lx - ",lVar3,pVar4);
    }
    if (CMtrace_timing != 0) {
      clock_gettime(1,&local_98);
      fprintf(*(FILE **)(local_20 + 0x120),"%lld.%.9ld - ",local_98.tv_sec,local_98.tv_nsec);
    }
    fprintf(*(FILE **)(local_20 + 0x120),"EVDFG exit deploy ack handler -  master DFG state is %s\n"
            ,str_state[*(uint *)(local_8 + 6)]);
  }
  fflush(*(FILE **)(local_20 + 0x120));
  return;
}

Assistant:

static void
handle_deploy_ack(EVmaster master, EVmaster_msg_ptr mmsg)
{
    EVdeploy_ack_ptr msg =  &mmsg->u.deploy_ack;
    CManager cm = master->cm;
    EVdfg dfg = master->dfg;
    master->dfg->deploy_ack_count++;
    CMtrace_out(cm, EVdfgVerbose, "Client %s reports deployed, count %d\n", msg->node_id, master->dfg->deploy_ack_count);
    if ((master->dfg->deploy_ack_count == dfg->master->node_count) && (dfg->deploy_ack_condition != -1)) {
	CMtrace_out(cm, EVdfgVerbose, "That was the last one, Signalling %d\n", dfg->deploy_ack_condition);
	CMtrace_out(cm, EVdfgVerbose, "EVDFG exit deploy ack handler -  master DFG state is %s\n", str_state[master->state]);
	CMCondition_signal(cm, master->dfg->deploy_ack_condition);
	master->dfg->deploy_ack_condition = -1;
	assert(master->state == DFG_Starting);
	master->state = DFG_Running;
	CMtrace_out(cm, EVdfgVerbose, "EVDFG  -  master DFG state set to %s\n", str_state[master->state]);
    } else {
      if (master->state == DFG_Reconfiguring) {
	  if (master->dfg->deploy_ack_count == dfg->master->node_count) {
	      master->state = DFG_Running;
	      CMtrace_out(cm, EVdfgVerbose, "EVDFG after reconfiguration -  master DFG state set to %s\n", str_state[master->state]);
	  } else {
	      CMtrace_out(cm, EVdfgVerbose, "EVDFG reconfiguration in progress.  Deploy ack count %d, -  master DFG state set remains %s\n", master->dfg->deploy_ack_count, 
			  str_state[master->state]);
	  }
      }
    }
    CMtrace_out(cm, EVdfgVerbose, "EVDFG exit deploy ack handler -  master DFG state is %s\n", str_state[master->state]);
}